

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.hh
# Opt level: O2

void __thiscall OptionIndentIncrement::OptionIndentIncrement(OptionIndentIncrement *this)

{
  (this->super_ArchOption).name._M_dataplus._M_p = (pointer)&(this->super_ArchOption).name.field_2;
  (this->super_ArchOption).name._M_string_length = 0;
  (this->super_ArchOption).name.field_2._M_local_buf[0] = '\0';
  (this->super_ArchOption)._vptr_ArchOption = (_func_int **)&PTR_apply_003f11b0;
  std::__cxx11::string::assign((char *)&(this->super_ArchOption).name);
  return;
}

Assistant:

OptionIndentIncrement(void) { name = "indentincrement"; }